

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

int SSE16x16_SSE2(uint8_t *a,uint8_t *b)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  lVar21 = 0;
  iVar22 = 0;
  iVar23 = 0;
  iVar24 = 0;
  iVar25 = 0;
  do {
    auVar30 = psubusb(*(undefined1 (*) [16])(a + lVar21),*(undefined1 (*) [16])(b + lVar21));
    auVar26 = psubusb(*(undefined1 (*) [16])(b + lVar21),*(undefined1 (*) [16])(a + lVar21));
    auVar26 = auVar26 | auVar30;
    auVar1[0xd] = 0;
    auVar1._0_13_ = auVar26._0_13_;
    auVar1[0xe] = auVar26[7];
    auVar3[0xc] = auVar26[6];
    auVar3._0_12_ = auVar26._0_12_;
    auVar3._13_2_ = auVar1._13_2_;
    auVar5[0xb] = 0;
    auVar5._0_11_ = auVar26._0_11_;
    auVar5._12_3_ = auVar3._12_3_;
    auVar7[10] = auVar26[5];
    auVar7._0_10_ = auVar26._0_10_;
    auVar7._11_4_ = auVar5._11_4_;
    auVar9[9] = 0;
    auVar9._0_9_ = auVar26._0_9_;
    auVar9._10_5_ = auVar7._10_5_;
    auVar11[8] = auVar26[4];
    auVar11._0_8_ = auVar26._0_8_;
    auVar11._9_6_ = auVar9._9_6_;
    auVar15._7_8_ = 0;
    auVar15._0_7_ = auVar11._8_7_;
    auVar17._1_8_ = SUB158(auVar15 << 0x40,7);
    auVar17[0] = auVar26[3];
    auVar17._9_6_ = 0;
    auVar18._1_10_ = SUB1510(auVar17 << 0x30,5);
    auVar18[0] = auVar26[2];
    auVar18._11_4_ = 0;
    auVar13[2] = auVar26[1];
    auVar13._0_2_ = auVar26._0_2_;
    auVar13._3_12_ = SUB1512(auVar18 << 0x20,3);
    auVar28._0_2_ = auVar26._0_2_ & 0xff;
    auVar28._2_13_ = auVar13._2_13_;
    auVar28[0xf] = 0;
    auVar28 = pmaddwd(auVar28,auVar28);
    auVar27[1] = 0;
    auVar27[0] = auVar26[8];
    auVar27[2] = auVar26[9];
    auVar27[3] = 0;
    auVar27[4] = auVar26[10];
    auVar27[5] = 0;
    auVar27[6] = auVar26[0xb];
    auVar27[7] = 0;
    auVar27[8] = auVar26[0xc];
    auVar27[9] = 0;
    auVar27[10] = auVar26[0xd];
    auVar27[0xb] = 0;
    auVar27[0xc] = auVar26[0xe];
    auVar27[0xd] = 0;
    auVar27[0xe] = auVar26[0xf];
    auVar27[0xf] = 0;
    auVar27 = pmaddwd(auVar27,auVar27);
    auVar30 = psubusb(*(undefined1 (*) [16])(a + lVar21 + 0x20),
                      *(undefined1 (*) [16])(b + lVar21 + 0x20));
    auVar26 = psubusb(*(undefined1 (*) [16])(b + lVar21 + 0x20),
                      *(undefined1 (*) [16])(a + lVar21 + 0x20));
    auVar26 = auVar26 | auVar30;
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar26._0_13_;
    auVar2[0xe] = auVar26[7];
    auVar4[0xc] = auVar26[6];
    auVar4._0_12_ = auVar26._0_12_;
    auVar4._13_2_ = auVar2._13_2_;
    auVar6[0xb] = 0;
    auVar6._0_11_ = auVar26._0_11_;
    auVar6._12_3_ = auVar4._12_3_;
    auVar8[10] = auVar26[5];
    auVar8._0_10_ = auVar26._0_10_;
    auVar8._11_4_ = auVar6._11_4_;
    auVar10[9] = 0;
    auVar10._0_9_ = auVar26._0_9_;
    auVar10._10_5_ = auVar8._10_5_;
    auVar12[8] = auVar26[4];
    auVar12._0_8_ = auVar26._0_8_;
    auVar12._9_6_ = auVar10._9_6_;
    auVar16._7_8_ = 0;
    auVar16._0_7_ = auVar12._8_7_;
    auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
    auVar19[0] = auVar26[3];
    auVar19._9_6_ = 0;
    auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
    auVar20[0] = auVar26[2];
    auVar20._11_4_ = 0;
    auVar14[2] = auVar26[1];
    auVar14._0_2_ = auVar26._0_2_;
    auVar14._3_12_ = SUB1512(auVar20 << 0x20,3);
    auVar29._0_2_ = auVar26._0_2_ & 0xff;
    auVar29._2_13_ = auVar14._2_13_;
    auVar29[0xf] = 0;
    auVar30[1] = 0;
    auVar30[0] = auVar26[8];
    auVar30[2] = auVar26[9];
    auVar30[3] = 0;
    auVar30[4] = auVar26[10];
    auVar30[5] = 0;
    auVar30[6] = auVar26[0xb];
    auVar30[7] = 0;
    auVar30[8] = auVar26[0xc];
    auVar30[9] = 0;
    auVar30[10] = auVar26[0xd];
    auVar30[0xb] = 0;
    auVar30[0xc] = auVar26[0xe];
    auVar30[0xd] = 0;
    auVar30[0xe] = auVar26[0xf];
    auVar30[0xf] = 0;
    auVar29 = pmaddwd(auVar29,auVar29);
    auVar26 = pmaddwd(auVar30,auVar30);
    iVar22 = auVar26._0_4_ + auVar29._0_4_ + auVar27._0_4_ + auVar28._0_4_ + iVar22;
    iVar23 = auVar26._4_4_ + auVar29._4_4_ + auVar27._4_4_ + auVar28._4_4_ + iVar23;
    iVar24 = auVar26._8_4_ + auVar29._8_4_ + auVar27._8_4_ + auVar28._8_4_ + iVar24;
    iVar25 = auVar26._12_4_ + auVar29._12_4_ + auVar27._12_4_ + auVar28._12_4_ + iVar25;
    lVar21 = lVar21 + 0x40;
  } while ((int)lVar21 != 0x200);
  return iVar25 + iVar23 + iVar24 + iVar22;
}

Assistant:

static int SSE16x16_SSE2(const uint8_t* a, const uint8_t* b) {
  return SSE_16xN_SSE2(a, b, 8);
}